

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O0

_Bool options_restore_custom(player_options *opts,int page)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  ang_file *f_00;
  char *pcVar4;
  char *pcVar5;
  size_t __n;
  size_t lname;
  int opt;
  char *com;
  char *sub;
  int linenum;
  ang_file *f;
  char file_name [80];
  char buf [1024];
  char path [1024];
  char *page_name;
  int page_local;
  player_options *opts_local;
  
  pcVar3 = option_type_name(page);
  strnfmt((char *)&f,0x50,"customized_%s_options.txt",pcVar3);
  path_build(buf + 0x3f8,0x400,ANGBAND_DIR_USER,(char *)&f);
  _Var1 = file_exists(buf + 0x3f8);
  if (_Var1) {
    f_00 = file_open(buf + 0x3f8,MODE_READ,FTYPE_TEXT);
    if (f_00 == (ang_file *)0x0) {
      opts_local._7_1_ = false;
    }
    else {
      sub._4_4_ = 1;
      while (_Var1 = file_getl(f_00,file_name + 0x48,0x400), _Var1) {
        pcVar4 = strstr(file_name + 0x48,"option:");
        if (pcVar4 == (char *)0x0) {
          pcVar4 = strchr(file_name + 0x48,0x23);
          if (pcVar4 != (char *)0x0) {
            *pcVar4 = '\0';
          }
          _Var1 = contains_only_spaces(file_name + 0x48);
          if (!_Var1) {
            msg("Line %d of the customized %s options is not parseable.",(ulong)sub._4_4_,pcVar3);
          }
          sub._4_4_ = sub._4_4_ + 1;
        }
        else {
          *pcVar4 = '\0';
          pcVar5 = strchr(file_name + 0x48,0x23);
          if (pcVar5 == (char *)0x0) {
            _Var1 = contains_only_spaces(file_name + 0x48);
            if (_Var1) {
              pcVar4 = pcVar4 + 7;
              lname._4_4_ = 0;
              while (lname._4_4_ < 0x2d) {
                if ((options[lname._4_4_].type == page) &&
                   (options[lname._4_4_].name != (char *)0x0)) {
                  __n = strlen(options[lname._4_4_].name);
                  iVar2 = strncmp(options[lname._4_4_].name,pcVar4,__n);
                  if ((iVar2 == 0) && (pcVar4[__n] == ':')) {
                    iVar2 = strncmp("yes",pcVar4 + __n + 1,3);
                    if ((iVar2 == 0) && (_Var1 = contains_only_spaces(pcVar4 + __n + 4), _Var1)) {
                      opts->opt[lname._4_4_] = true;
                    }
                    else {
                      iVar2 = strncmp("no",pcVar4 + __n + 1,2);
                      if ((iVar2 == 0) && (_Var1 = contains_only_spaces(pcVar4 + __n + 3), _Var1)) {
                        opts->opt[lname._4_4_] = false;
                      }
                      else {
                        msg("Value at line %d of the customized %s options is not yes or no.",
                            (ulong)sub._4_4_,pcVar3);
                      }
                    }
                    goto LAB_001dad7f;
                  }
                  lname._4_4_ = lname._4_4_ + 1;
                }
                else {
                  lname._4_4_ = lname._4_4_ + 1;
                }
              }
              msg("Unrecognized option at line %d of the customized %s options.",(ulong)sub._4_4_,
                  pcVar3);
LAB_001dad7f:
              sub._4_4_ = sub._4_4_ + 1;
            }
            else {
              msg("Line %d of the customized %s options is not parseable.",(ulong)sub._4_4_,pcVar3);
              sub._4_4_ = sub._4_4_ + 1;
            }
          }
          else {
            *pcVar5 = '\0';
            _Var1 = contains_only_spaces(file_name + 0x48);
            if (!_Var1) {
              msg("Line %d of the customized %s options is not parseable.",(ulong)sub._4_4_,pcVar3);
            }
            sub._4_4_ = sub._4_4_ + 1;
          }
        }
      }
      _Var1 = file_close(f_00);
      if (_Var1) {
        opts_local._7_1_ = true;
      }
      else {
        opts_local._7_1_ = false;
      }
    }
  }
  else {
    options_restore_maintainer(opts,page);
    opts_local._7_1_ = true;
  }
  return opts_local._7_1_;
}

Assistant:

bool options_restore_custom(struct player_options *opts, int page)
{
	const char *page_name = option_type_name(page);
	char path[1024], buf[1024], file_name[80];
	ang_file *f;
	int linenum;

	strnfmt(file_name, sizeof(file_name), "customized_%s_options.txt",
		page_name);
	path_build(path, sizeof(path), ANGBAND_DIR_USER, file_name);
	if (!file_exists(path)) {
		options_restore_maintainer(opts, page);
		return true;
	}

	/*
	 * Could use run_parser(), but that exits the application if
	 * there are syntax errors.  Therefore, use our own parsing.
	 */
	f = file_open(path, MODE_READ, FTYPE_TEXT);
	if (!f) {
		return false;
	}
	linenum = 1;
	while (file_getl(f, buf, sizeof(buf))) {
		char *sub = strstr(buf, "option:"), *com;
		int opt;

		if (!sub) {
			/*
			 * If it isn't an option, it should be a comment or
			 * whitespace.
			 */
			sub = strchr(buf, '#');

			if (sub) {
				*sub = '\0';
			}
			if (!contains_only_spaces(buf)) {
				msg("Line %d of the customized %s options is "
					"not parseable.", linenum, page_name);
			}
			++linenum;
			continue;
		}

		*sub = '\0';
		/* Ignore if the "option:" is embedded in a comment. */
		com = strchr(buf, '#');
		if (com) {
			*com = '\0';
			if (!contains_only_spaces(buf)) {
				msg("Line %d of the customized %s options is "
					"not parseable.", linenum, page_name);
			}
			++linenum;
			continue;
		}
		if (!contains_only_spaces(buf)) {
			msg("Line %d of the customized %s options is not "
					"parseable.", linenum, page_name);
			++linenum;
			continue;
		}

		/* Try to find the option. */
		sub += 7;
		opt = 0;
		while (1) {
			size_t lname;

			if (opt >= OPT_MAX) {
				msg("Unrecognized option at line %d of the "
					"customized %s options.", linenum,
					page_name);
				break;
			}
			if (options[opt].type != page || !options[opt].name) {
				++opt;
				continue;
			}
			lname = strlen(options[opt].name);
			if (strncmp(options[opt].name, sub, lname) == 0
					&& sub[lname] == ':') {
				if (strncmp("yes", sub + lname + 1, 3) == 0
						&& contains_only_spaces(sub + lname + 4)) {
					(*opts).opt[opt] = true;
				} else if (strncmp("no", sub + lname + 1, 2) == 0
						&& contains_only_spaces(sub + lname + 3)) {
					(*opts).opt[opt] = false;
				} else {
					msg("Value at line %d of the "
						"customized %s options is not "
						"yes or no.", linenum,
						page_name);
				}
				break;
			}
			++opt;
		}
		++linenum;
	}

	if (!file_close(f)) {
		return false;
	}

	return true;
}